

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bound_expanded_expression.cpp
# Opt level: O3

unique_ptr<duckdb::Expression,_std::default_delete<duckdb::Expression>,_true> __thiscall
duckdb::BoundExpandedExpression::Copy(BoundExpandedExpression *this)

{
  SerializationException *this_00;
  string local_40;
  
  this_00 = (SerializationException *)__cxa_allocate_exception(0x10);
  local_40._M_dataplus._M_p = (pointer)&local_40.field_2;
  ::std::__cxx11::string::_M_construct<char_const*>
            ((string *)&local_40,"Cannot copy BoundExpandedExpression","");
  SerializationException::SerializationException(this_00,&local_40);
  __cxa_throw(this_00,&SerializationException::typeinfo,::std::runtime_error::~runtime_error);
}

Assistant:

unique_ptr<Expression> BoundExpandedExpression::Copy() const {
	throw SerializationException("Cannot copy BoundExpandedExpression");
}